

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_d205b::schema::make
          (schema *this,json *schema,root_schema *root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris)

{
  _Rb_tree_header *p_Var1;
  json *ptr;
  size_t *psVar2;
  json_pointer<std::__cxx11::string> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  value_t vVar4;
  pointer pbVar5;
  json_uri *pjVar6;
  size_type sVar7;
  _func_int **pp_Var8;
  pointer pjVar9;
  long lVar10;
  undefined1 auVar11 [16];
  long lVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  int iVar15;
  schema *__tmp;
  iterator __position;
  root_schema *prVar16;
  reference pbVar17;
  __normal_iterator<nlohmann::json_uri_*,_std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>_>
  _Var18;
  iterator iVar19;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *schema_00;
  iterator iVar20;
  root_schema *prVar21;
  _Base_ptr p_Var22;
  byte extraout_var;
  _Rb_tree_node_base *p_Var23;
  schema_file *psVar24;
  iterator iVar25;
  byte extraout_var_00;
  _Rb_tree_node_base *p_Var26;
  iterator iVar27;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
  *this_01;
  string_type *key_00;
  invalid_argument *piVar28;
  long *plVar29;
  undefined **ppuVar30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keylen;
  schema_file *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  long *plVar33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer field;
  _Base_ptr *pp_Var35;
  _Base_ptr p_Var36;
  undefined8 uVar37;
  _Link_type __p;
  undefined1 auVar38 [8];
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__args_2;
  json_uri *uri;
  json_uri *pjVar39;
  pointer pjVar40;
  iterator iVar41;
  schema *__tmp_1;
  _Manager_type *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  bool bVar42;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar43;
  shared_ptr<(anonymous_namespace)::schema> sVar44;
  initializer_list<nlohmann::json_uri> __l;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__range2;
  bool ret;
  iterator attr;
  json_uri id;
  anon_class_32_4_9864ab46 findDefinitions;
  undefined1 local_2d8 [32];
  _Alloc_hider local_2b8;
  root_schema *prStack_2b0;
  string local_298 [32];
  string local_278 [32];
  pointer local_258;
  pointer pbStack_250;
  pointer local_248;
  string local_240 [32];
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_210;
  undefined1 local_208 [8];
  json_value jStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  iterator local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [184];
  root_schema **local_f0;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_e8;
  string local_d0;
  anon_class_32_4_9864ab46 local_b0;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_90;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  __position._M_current =
       (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl.
       super__Vector_impl_data._M_start;
  keylen = keys;
  __args_2 = uris;
  local_220._0_8_ = root;
  if (__position._M_current !=
      (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar15 = std::__cxx11::string::compare((char *)&(__position._M_current)->identifier_);
      if (iVar15 == 0) {
        __position._M_current = __position._M_current + 1;
      }
      else {
        __position = std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::_M_erase
                               (uris,__position);
      }
    } while (__position._M_current !=
             (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  field = (keys->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (field != pbVar5) {
    do {
      pjVar6 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pjVar39 = (uris->
                     super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                     _M_impl.super__Vector_impl_data._M_start; pjVar39 != pjVar6;
          pjVar39 = pjVar39 + 1) {
        nlohmann::json_uri::append((json_uri *)local_2d8,pjVar39,field);
        std::__cxx11::string::operator=((string *)pjVar39,(string *)local_2d8);
        std::__cxx11::string::operator=((string *)&pjVar39->scheme_,(string *)&local_2b8);
        std::__cxx11::string::operator=((string *)&pjVar39->authority_,local_298);
        std::__cxx11::string::operator=((string *)&pjVar39->path_,local_278);
        local_1a8._0_8_ =
             (pjVar39->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1a8._8_8_ =
             (pjVar39->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8._16_8_ =
             (pjVar39->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pjVar39->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_258;
        (pjVar39->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbStack_250;
        (pjVar39->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_248;
        keylen = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
        local_258 = (pointer)0x0;
        pbStack_250 = (pointer)0x0;
        local_248 = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a8);
        std::__cxx11::string::operator=((string *)&pjVar39->identifier_,local_240);
        nlohmann::json_uri::~json_uri((json_uri *)local_2d8);
      }
      field = field + 1;
    } while (field != pbVar5);
  }
  this->_vptr_schema = (_func_int **)0x0;
  this->root_ = (root_schema *)0x0;
  if (schema->m_type != object) {
    if (schema->m_type != boolean) {
      piVar28 = (invalid_argument *)__cxa_allocate_exception(0x10);
      nlohmann::json_uri::to_string_abi_cxx11_
                ((string *)local_208,
                 (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)
                 ._M_impl.super__Vector_impl_data._M_start);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "invalid JSON-type for a schema for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
      ;
      plVar29 = (long *)std::__cxx11::string::append(local_1a8);
      local_2d8._0_8_ = *plVar29;
      plVar33 = plVar29 + 2;
      if ((long *)local_2d8._0_8_ == plVar33) {
        lVar10 = *plVar33;
        lVar12 = plVar29[3];
        local_2d8._16_4_ = (undefined4)lVar10;
        local_2d8._20_2_ = (undefined2)((ulong)lVar10 >> 0x20);
        local_2d8[0x16] = (undefined1)((ulong)lVar10 >> 0x30);
        local_2d8[0x17] = (undefined1)((ulong)lVar10 >> 0x38);
        local_2d8._24_3_ = (undefined3)lVar12;
        local_2d8[0x1b] = (undefined1)((ulong)lVar12 >> 0x18);
        local_2d8._28_4_ = (undefined4)((ulong)lVar12 >> 0x20);
        local_2d8._0_8_ = local_2d8 + 0x10;
      }
      else {
        lVar10 = *plVar33;
        local_2d8._16_4_ = (undefined4)lVar10;
        local_2d8._20_2_ = (undefined2)((ulong)lVar10 >> 0x20);
        local_2d8[0x16] = (undefined1)((ulong)lVar10 >> 0x30);
        local_2d8[0x17] = (undefined1)((ulong)lVar10 >> 0x38);
      }
      local_2d8._8_8_ = plVar29[1];
      *plVar29 = (long)plVar33;
      plVar29[1] = 0;
      *(undefined1 *)(plVar29 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar28,(string *)local_2d8);
      __cxa_throw(piVar28,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    prVar16 = (root_schema *)operator_new(0x38);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0016b1b0;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_220._0_8_;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    ppuVar30 = &PTR_make_for_default__0016b200;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0016b200;
    local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_2::detail::
    from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (schema,(boolean_t *)local_2d8);
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71((int7)((ulong)ppuVar30 >> 8),local_2d8[0]);
    *(string *)&(prVar16->format_check_).super__Function_base._M_manager = local_2d8[0];
    this->_vptr_schema = (_func_int **)&(prVar16->loader_).super__Function_base._M_manager;
    prVar21 = this->root_;
    this->root_ = prVar16;
    _Var34._M_pi = extraout_RDX;
    if (prVar21 != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar21);
      _Var34._M_pi = extraout_RDX_00;
    }
    goto LAB_001309f2;
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[4],_0>(&local_1e8,schema,(char (*) [4])"$id");
  vVar4 = schema->m_type;
  if ((vVar4 != array) && (vVar4 != object)) {
    keylen = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x8000000000000000;
  }
  local_2d8._24_3_ = 0;
  local_2d8[0x17] = '\0';
  local_2d8._28_4_ = 0x80000000;
  local_2d8[0x16] = '\0';
  local_2d8._20_2_ = 0;
  local_2d8._16_4_ = 0;
  local_2d8._8_8_ = (_Base_ptr)0x0;
  if (vVar4 == array) {
    sVar7 = ((schema->m_value).string)->_M_string_length;
    local_2d8._16_4_ = (undefined4)sVar7;
    local_2d8._20_2_ = (undefined2)(sVar7 >> 0x20);
    local_2d8[0x16] = (undefined1)(sVar7 >> 0x30);
    local_2d8[0x17] = (undefined1)(sVar7 >> 0x38);
    local_2d8._24_3_ = 0;
  }
  else if (vVar4 == object) {
    local_2d8._8_8_ = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    local_2d8._24_3_ = 1;
    local_2d8._28_4_ = 0;
  }
  local_2d8[0x1b] = '\0';
  local_2d8._0_8_ = schema;
  bVar42 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&local_1e8,
                      (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_2d8);
  if (!bVar42) {
    pjVar40 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pjVar9 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pbVar17 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_1e8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_2d8,pbVar17);
    _Var18 = std::
             __find_if<__gnu_cxx::__normal_iterator<nlohmann::json_uri*,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pjVar40,pjVar9,local_2d8);
    pjVar39 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((json *)local_2d8._0_8_ != (json *)(local_2d8 + 0x10)) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT17(local_2d8[0x17],
                               CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_))
                              ) + 1);
    }
    if (_Var18._M_current == pjVar39) {
      pjVar40 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_1e8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_1a8,pbVar17);
      nlohmann::json_uri::derive
                ((json_uri *)local_2d8,(EVP_PKEY_CTX *)(pjVar40 + -1),local_1a8,(size_t *)keylen);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::
      emplace_back<nlohmann::json_uri>(uris,(json_uri *)local_2d8);
      nlohmann::json_uri::~json_uri((json_uri *)local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
    }
    local_50.m_object = local_1e8.m_object;
    local_50.m_it.object_iterator._M_node = local_1e8.m_it.object_iterator._M_node;
    local_50.m_it.array_iterator._M_current = local_1e8.m_it.array_iterator._M_current;
    local_50.m_it.primitive_iterator.m_it = local_1e8.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_2d8,schema,&local_50);
  }
  local_b0.root = (root_schema **)local_220;
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2d8 + 0x10);
  local_2d8._16_4_ = 0x66656424;
  local_2d8._20_2_ = 0x73;
  local_2d8._8_8_ = (_Rb_tree_node_base *)0x5;
  local_2d8._0_8_ = paVar32;
  local_b0.attr = &local_1e8;
  local_b0.schema = schema;
  local_b0.uris = uris;
  bVar42 = make::anon_class_32_4_9864ab46::operator()(&local_b0,(string *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != paVar32) {
    operator_delete((void *)local_2d8._0_8_,
                    CONCAT17(local_2d8[0x17],
                             CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_)))
                    + 1);
  }
  if (!bVar42) {
    local_2d8._16_4_ = 0x69666564;
    local_2d8._20_2_ = 0x696e;
    local_2d8[0x16] = 't';
    local_2d8[0x17] = 'i';
    local_2d8._24_3_ = 0x736e6f;
    local_2d8._8_8_ = (_Rb_tree_node_base *)0xb;
    local_2d8[0x1b] = '\0';
    local_2d8._0_8_ = paVar32;
    make::anon_class_32_4_9864ab46::operator()(&local_b0,(string *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != paVar32) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT17(local_2d8[0x17],
                               CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_))
                              ) + 1);
    }
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[5],_0>((iterator *)local_2d8,schema,(char (*) [5])"$ref");
  local_1e8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)CONCAT17(local_2d8[0x17],
                   CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_)));
  local_1e8.m_it.primitive_iterator.m_it =
       CONCAT44(local_2d8._28_4_,CONCAT13(local_2d8[0x1b],local_2d8._24_3_));
  local_1e8.m_object = (pointer)local_2d8._0_8_;
  local_1e8.m_it.object_iterator._M_node = (_Base_ptr)local_2d8._8_8_;
  vVar4 = schema->m_type;
  if ((vVar4 != array) && (vVar4 != object)) {
    keylen = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x8000000000000000;
  }
  local_2d8._23_4_ = 0;
  local_2d8._28_4_ = 0x80000000;
  local_2d8[0x16] = '\0';
  local_2d8._20_2_ = 0;
  local_2d8._16_4_ = 0;
  local_2d8._8_8_ = (_Rb_tree_node_base *)0x0;
  if (vVar4 == array) {
    sVar7 = ((schema->m_value).string)->_M_string_length;
    local_2d8._16_4_ = (undefined4)sVar7;
    local_2d8._20_2_ = (undefined2)(sVar7 >> 0x20);
    local_2d8[0x16] = (undefined1)(sVar7 >> 0x30);
    local_2d8[0x17] = (undefined1)(sVar7 >> 0x38);
    local_2d8._24_3_ = 0;
  }
  else if (vVar4 == object) {
    local_2d8._8_8_ = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    local_2d8._23_4_ = 0x100;
    local_2d8._28_4_ = 0;
  }
  local_2d8[0x1b] = '\0';
  local_2d8._0_8_ = schema;
  bVar42 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&local_1e8,
                      (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_2d8);
  if (bVar42) {
    prVar16 = (root_schema *)operator_new(0xc0);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0016b338;
    this_02 = &(prVar16->loader_).super__Function_base._M_manager;
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uris;
    __gnu_cxx::new_allocator<(anonymous_namespace)::type_schema>::
    construct<(anonymous_namespace)::type_schema,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,nlohmann::json_schema::root_schema*&,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>&>
              ((new_allocator<(anonymous_namespace)::type_schema> *)this_02,(type_schema *)schema,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_220,(root_schema **)uris,__args_2);
    this->_vptr_schema = (_func_int **)this_02;
    prVar21 = this->root_;
    this->root_ = prVar16;
    if (prVar21 != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar21);
    }
  }
  else {
    pjVar40 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pbVar17 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_1e8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_2d8,pbVar17);
    nlohmann::json_uri::derive
              ((json_uri *)local_1a8,(EVP_PKEY_CTX *)(pjVar40 + -1),local_2d8,(size_t *)keylen);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != paVar32) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT17(local_2d8[0x17],
                               CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_))
                              ) + 1);
    }
    uVar37 = local_220._0_8_;
    nlohmann::json_uri::location_abi_cxx11_((string *)local_2d8,(json_uri *)local_1a8);
    psVar24 = nlohmann::json_schema::root_schema::get_or_create_file
                        ((root_schema *)uVar37,(string *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != paVar32) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT17(local_2d8[0x17],
                               CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_))
                              ) + 1);
    }
    nlohmann::json_uri::fragment_abi_cxx11_((string *)local_2d8,(json_uri *)local_1a8);
    p_Var1 = &(psVar24->schemas)._M_t._M_impl.super__Rb_tree_header;
    __k = psVar24;
    iVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)(psVar24->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent,(_Link_type)p_Var1,(_Base_ptr)local_2d8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              psVar24);
    iVar25._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)iVar19._M_node != p_Var1) &&
       (iVar15 = std::__cxx11::string::compare((string *)local_2d8), iVar25 = iVar19, iVar15 < 0)) {
      iVar25._M_node = &p_Var1->_M_header;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._0_8_ != paVar32) {
      operator_delete((void *)local_2d8._0_8_,
                      CONCAT17(local_2d8[0x17],
                               CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_))
                              ) + 1);
    }
    if ((_Rb_tree_header *)iVar25._M_node == p_Var1) {
      this_00 = (json_pointer<std::__cxx11::string> *)(local_1a8 + 0x80);
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::to_string((string_t *)local_2d8,
                  (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
      uVar13 = local_2d8._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ != paVar32) {
        operator_delete((void *)local_2d8._0_8_,
                        CONCAT17(local_2d8[0x17],
                                 CONCAT16(local_2d8[0x16],
                                          CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
      }
      if ((_Rb_tree_node_base *)uVar13 == (_Rb_tree_node_base *)0x0) {
LAB_001303d7:
        nlohmann::json_uri::fragment_abi_cxx11_((string *)local_2d8,(json_uri *)local_1a8);
        p_Var1 = &(psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header;
        iVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                 ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                                   *)(psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_parent,(_Link_type)p_Var1,(_Base_ptr)local_2d8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__k);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._0_8_ != paVar32) {
          operator_delete((void *)local_2d8._0_8_,
                          CONCAT17(local_2d8[0x17],
                                   CONCAT16(local_2d8[0x16],
                                            CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
        }
        if ((_Rb_tree_header *)iVar20._M_node == p_Var1) {
          bVar42 = false;
        }
        else {
          nlohmann::json_uri::fragment_abi_cxx11_(&local_d0,(json_uri *)local_1a8);
          iVar15 = std::__cxx11::string::compare((string *)&local_d0);
          bVar42 = -1 < iVar15;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar42) {
          local_220._8_8_ = *(json_value *)(iVar20._M_node + 2);
          paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)iVar20._M_node[2]._M_parent;
          goto joined_r0x001304a3;
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)local_208,(json_uri *)local_1a8);
        nlohmann::json_uri::to_string_abi_cxx11_((string *)local_1c8,(json_uri *)local_1a8);
        prVar21 = (root_schema *)operator_new(0x70);
        *(_Base_ptr *)((long)&(prVar21->loader_).super__Function_base._M_functor + 8) =
             (_Base_ptr)0x100000001;
        *(undefined ***)&(prVar21->loader_).super__Function_base._M_functor =
             &PTR___Sp_counted_ptr_inplace_0016b298;
        pp_Var35 = (_Base_ptr *)&(prVar21->loader_).super__Function_base._M_manager;
        schema_ref::schema_ref((schema_ref *)pp_Var35,(string *)local_1c8,(root_schema *)uVar37);
        uVar14 = local_2d8._23_4_;
        local_2d8[0x16] = (undefined1)((ulong)local_1f8._0_8_ >> 0x30);
        local_2d8[0x17] = (undefined1)((ulong)local_1f8._0_8_ >> 0x38);
        local_2d8._20_2_ = (undefined2)((ulong)local_1f8._0_8_ >> 0x20);
        local_2d8._16_4_ = (undefined4)local_1f8._M_allocated_capacity;
        if (local_208 == (undefined1  [8])&local_1f8) {
          local_2d8._24_3_ = (undefined3)local_1f8._8_8_;
          local_2d8[0x1b] = (undefined1)((ulong)local_1f8._8_8_ >> 0x18);
          local_2d8._28_4_ = (undefined4)((ulong)local_1f8._8_8_ >> 0x20);
          local_2d8._0_8_ = paVar32;
        }
        else {
          local_2d8._0_8_ = local_208;
          local_2d8._24_3_ = SUB43(uVar14,1);
        }
        local_2d8._8_8_ = jStack_200;
        jStack_200.object = (object_t *)0x0;
        local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
        local_2b8._M_p = (pointer)pp_Var35;
        prStack_2b0 = prVar21;
        local_208 = (undefined1  [8])&local_1f8;
        if ((_Rb_tree_header *)iVar20._M_node == p_Var1) {
          if (((psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (iVar15 = std::__cxx11::string::compare
                                 ((string *)
                                  ((psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_right + 1)), -1 < iVar15)) {
LAB_00130664:
            pVar43 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                     ::_M_get_insert_unique_pos(&(psVar24->unresolved)._M_t,(key_type *)local_2d8);
          }
          else {
            p_Var36 = (psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_0013068c:
            auVar11._8_8_ = 0;
            auVar11._0_8_ = p_Var36;
            pVar43 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar11 << 0x40);
          }
        }
        else {
          iVar15 = std::__cxx11::string::compare((string *)local_2d8);
          if (iVar15 < 0) {
            p_Var36 = (psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar43.second = p_Var36;
            pVar43.first = p_Var36;
            if (p_Var36 != iVar20._M_node) {
              p_Var22 = (_Base_ptr)std::_Rb_tree_decrement(iVar20._M_node);
              iVar15 = std::__cxx11::string::compare((string *)(p_Var22 + 1));
              if (-1 < iVar15) goto LAB_00130664;
              iVar41 = iVar20;
              if (p_Var22->_M_right == (_Base_ptr)0x0) {
                iVar41._M_node = (_Base_ptr)0x0;
                iVar20._M_node = p_Var22;
              }
LAB_001306a0:
              pVar43.second = iVar20._M_node;
              pVar43.first = iVar41._M_node;
            }
          }
          else {
            iVar15 = std::__cxx11::string::compare((string *)(iVar20._M_node + 1));
            if (iVar15 < 0) {
              p_Var36 = (psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
              if (p_Var36 == iVar20._M_node) goto LAB_0013068c;
              p_Var22 = (_Base_ptr)std::_Rb_tree_increment(iVar20._M_node);
              iVar15 = std::__cxx11::string::compare((string *)local_2d8);
              if (iVar15 < 0) {
                iVar41._M_node = (iVar20._M_node)->_M_right;
                if ((iVar20._M_node)->_M_right != (_Base_ptr)0x0) {
                  iVar41._M_node = p_Var22;
                  iVar20._M_node = p_Var22;
                }
                goto LAB_001306a0;
              }
              goto LAB_00130664;
            }
            pVar43.second = (_Rb_tree_node_base *)0x0;
            pVar43.first = iVar20._M_node;
          }
        }
        p_Var26 = pVar43.second;
        p_Var23 = pVar43.first;
        if (p_Var26 != (_Rb_tree_node_base *)0x0) {
          bVar42 = true;
          if ((p_Var23 == (_Rb_tree_node_base *)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var26)) {
            std::__cxx11::string::compare((string *)local_2d8);
            bVar42 = (bool)(extraout_var >> 7);
          }
          p_Var23 = (_Rb_tree_node_base *)operator_new(0x50);
          *(_Base_ptr **)(p_Var23 + 1) = &p_Var23[1]._M_left;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(p_Var23 + 1),local_2d8._0_8_,
                     (char *)(local_2d8._0_8_ + (long)(_Rep_type *)local_2d8._8_8_));
          prVar21 = prStack_2b0;
          p_Var23[2]._M_parent = (_Base_ptr)0x0;
          prStack_2b0 = (root_schema *)0x0;
          *(pointer *)(p_Var23 + 2) = local_2b8._M_p;
          p_Var23[2]._M_parent = (_Base_ptr)prVar21;
          local_2b8._M_p = (pointer)0x0;
          std::_Rb_tree_insert_and_rebalance(bVar42,p_Var23,p_Var26,&p_Var1->_M_header);
          psVar2 = &(psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *psVar2 = *psVar2 + 1;
        }
        local_220._8_8_ = *(json_value *)(p_Var23 + 2);
        paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)p_Var23[2]._M_parent;
        if (paStack_210 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)paStack_210 + 8) = *(int *)((long)paStack_210 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)paStack_210 + 8) = *(int *)((long)paStack_210 + 8) + 1;
          }
        }
        if (prStack_2b0 != (root_schema *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prStack_2b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._0_8_ != paVar32) {
          operator_delete((void *)local_2d8._0_8_,
                          CONCAT17(local_2d8[0x17],
                                   CONCAT16(local_2d8[0x16],
                                            CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
        }
        if ((_Base_ptr)local_1c8._0_8_ != (_Base_ptr)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        uVar37 = local_1f8._M_allocated_capacity;
        auVar38 = local_208;
        if (local_208 != (undefined1  [8])&local_1f8) {
LAB_001307c1:
          operator_delete((void *)auVar38,(ulong)((long)&((_Base_ptr)uVar37)->_M_color + 1));
        }
      }
      else {
        ptr = &psVar24->unknown_keywords;
        bVar42 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                 contains<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           (this_00,ptr);
        if (!bVar42) goto LAB_001303d7;
        schema_00 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                    get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              (this_00,ptr);
        local_208 = (undefined1  [8])0x0;
        jStack_200.object = (object_t *)0x0;
        local_1f8._M_allocated_capacity = 0;
        nlohmann::json_uri::json_uri((json_uri *)local_2d8,(json_uri *)local_1a8);
        __l._M_len = 1;
        __l._M_array = (iterator)local_2d8;
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_e8,__l,(allocator_type *)local_1c8);
        __k = (schema_file *)local_208;
        make((schema *)(local_220 + 8),schema_00,(root_schema *)uVar37,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__k,&local_e8);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_e8);
        nlohmann::json_uri::~json_uri((json_uri *)local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
        if ((object_t *)local_220._8_8_ == (object_t *)0x0) {
          if (paStack_210 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paStack_210);
          }
          goto LAB_001303d7;
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)local_2d8,(json_uri *)local_1a8);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        erase_internal<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  (ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._0_8_ != paVar32) {
          uVar37 = (_Base_ptr)
                   CONCAT17(local_2d8[0x17],
                            CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_)));
          auVar38 = (undefined1  [8])local_2d8._0_8_;
          goto LAB_001307c1;
        }
      }
    }
    else {
      local_220._8_8_ = *(undefined8 *)(iVar25._M_node + 2);
      paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)iVar25._M_node[2]._M_parent;
joined_r0x001304a3:
      if (paStack_210 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)paStack_210 + 8) = *(int *)((long)paStack_210 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)paStack_210 + 8) = *(int *)((long)paStack_210 + 8) + 1;
        }
      }
    }
    paVar32 = paStack_210;
    uVar37 = local_220._8_8_;
    local_220._8_8_ = (object_t *)0x0;
    paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    prVar21 = this->root_;
    this->_vptr_schema = (_func_int **)uVar37;
    this->root_ = (root_schema *)paVar32;
    if (prVar21 != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar21);
    }
    if (paStack_210 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paStack_210);
    }
    local_70.m_object = local_1e8.m_object;
    local_70.m_it.object_iterator._M_node = local_1e8.m_it.object_iterator._M_node;
    local_70.m_it.array_iterator._M_current = local_1e8.m_it.array_iterator._M_current;
    local_70.m_it.primitive_iterator.m_it = local_1e8.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_2d8,schema,&local_70);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)local_2d8,schema,(char (*) [8])"default");
    local_1e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)CONCAT17(local_2d8[0x17],
                     CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_)));
    local_1e8.m_it.primitive_iterator.m_it =
         CONCAT44(local_2d8._28_4_,CONCAT13(local_2d8[0x1b],local_2d8._24_3_));
    local_1e8.m_object = (pointer)local_2d8._0_8_;
    local_1e8.m_it.object_iterator._M_node = (_Base_ptr)local_2d8._8_8_;
    vVar4 = schema->m_type;
    if ((vVar4 != array) && (vVar4 != object)) {
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x8000000000000000;
    }
    local_2d8._23_4_ = 0;
    local_2d8._28_4_ = 0x80000000;
    local_2d8[0x16] = '\0';
    local_2d8._20_2_ = 0;
    local_2d8._16_4_ = 0;
    local_2d8._8_8_ = (_Rb_tree_node_base *)0x0;
    if (vVar4 == array) {
      sVar7 = ((schema->m_value).string)->_M_string_length;
      local_2d8._16_4_ = (undefined4)sVar7;
      local_2d8._20_2_ = (undefined2)(sVar7 >> 0x20);
      local_2d8[0x16] = (undefined1)(sVar7 >> 0x30);
      local_2d8[0x17] = (undefined1)(sVar7 >> 0x38);
      local_2d8._24_3_ = 0;
    }
    else if (vVar4 == object) {
      local_2d8._8_8_ = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_2d8._23_4_ = 0x100;
      local_2d8._28_4_ = 0;
    }
    local_2d8[0x1b] = '\0';
    local_2d8._0_8_ = schema;
    bVar42 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       (&local_1e8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_2d8);
    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._0_8_;
    if (!bVar42) {
      pp_Var8 = this->_vptr_schema;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_1e8);
      (**(code **)*pp_Var8)(local_2d8,pp_Var8,this,paVar31,uris,pbVar17);
      paVar32 = paVar31;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        this->_vptr_schema = (_func_int **)local_2d8._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->root_,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
        paVar32 = paVar31;
      }
      if ((_Rb_tree_node_base *)local_2d8._8_8_ != (_Rb_tree_node_base *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      local_90.m_object = local_1e8.m_object;
      local_90.m_it.object_iterator._M_node = local_1e8.m_it.object_iterator._M_node;
      local_90.m_it.array_iterator._M_current = local_1e8.m_it.array_iterator._M_current;
      local_90.m_it.primitive_iterator.m_it = local_1e8.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_2d8,schema,&local_90);
    }
    nlohmann::json_uri::~json_uri((json_uri *)local_1a8);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[8],_0>(schema,(char (*) [8])"$schema");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[6],_0>(schema,(char (*) [6])"title");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[12],_0>(schema,(char (*) [12])"description");
  _Var34._M_pi = extraout_RDX_01;
LAB_001309f2:
  pjVar40 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pjVar9 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pjVar40 != pjVar9) {
    local_f0 = &this->root_;
    do {
      uVar37 = local_220._0_8_;
      nlohmann::json_uri::location_abi_cxx11_((string *)local_2d8,pjVar40);
      psVar24 = nlohmann::json_schema::root_schema::get_or_create_file
                          ((root_schema *)uVar37,(string *)local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,
                        CONCAT17(local_2d8[0x17],
                                 CONCAT16(local_2d8[0x16],
                                          CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)local_2d8,pjVar40);
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(psVar24->schemas)._M_t._M_impl.super__Rb_tree_header;
      iVar25 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
               ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                                 *)(psVar24->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent,(_Link_type)paVar31,(_Base_ptr)local_2d8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )paVar32);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,
                        CONCAT17(local_2d8[0x17],
                                 CONCAT16(local_2d8[0x16],
                                          CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iVar25._M_node == paVar31) {
        bVar42 = false;
      }
      else {
        nlohmann::json_uri::fragment_abi_cxx11_((string *)local_208,pjVar40);
        iVar15 = std::__cxx11::string::compare((string *)local_208);
        bVar42 = -1 < iVar15;
        if (local_208 != (undefined1  [8])&local_1f8) {
          operator_delete((void *)local_208,(ulong)(local_1f8._M_allocated_capacity + 1));
        }
      }
      if (bVar42) {
        piVar28 = (invalid_argument *)__cxa_allocate_exception(0x10);
        nlohmann::json_uri::to_string_abi_cxx11_((string *)local_1c8,pjVar40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"schema with ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
        plVar29 = (long *)std::__cxx11::string::append(local_1a8);
        local_2d8._0_8_ = *plVar29;
        plVar33 = plVar29 + 2;
        if ((long *)local_2d8._0_8_ == plVar33) {
          lVar10 = *plVar33;
          lVar12 = plVar29[3];
          local_2d8._16_4_ = (undefined4)lVar10;
          local_2d8._20_2_ = (undefined2)((ulong)lVar10 >> 0x20);
          local_2d8[0x16] = (undefined1)((ulong)lVar10 >> 0x30);
          local_2d8[0x17] = (undefined1)((ulong)lVar10 >> 0x38);
          local_2d8._24_3_ = (undefined3)lVar12;
          local_2d8[0x1b] = (undefined1)((ulong)lVar12 >> 0x18);
          local_2d8._28_4_ = (undefined4)((ulong)lVar12 >> 0x20);
          local_2d8._0_8_ = local_2d8 + 0x10;
        }
        else {
          lVar10 = *plVar33;
          local_2d8._16_4_ = (undefined4)lVar10;
          local_2d8._20_2_ = (undefined2)((ulong)lVar10 >> 0x20);
          local_2d8[0x16] = (undefined1)((ulong)lVar10 >> 0x30);
          local_2d8[0x17] = (undefined1)((ulong)lVar10 >> 0x38);
        }
        local_2d8._8_8_ = plVar29[1];
        *plVar29 = (long)plVar33;
        plVar29[1] = 0;
        *(undefined1 *)(plVar29 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar28,(string *)local_2d8);
        __cxa_throw(piVar28,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)local_1a8,pjVar40);
      uVar14 = local_2d8._23_4_;
      local_2d8._0_8_ = local_2d8 + 0x10;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1a8 + 0x10);
      local_2d8[0x16] = SUB81(local_1a8._16_8_,6);
      local_2d8[0x17] = SUB81(local_1a8._16_8_,7);
      local_2d8._20_2_ = SUB82(local_1a8._16_8_,4);
      local_2d8._16_4_ = (undefined4)local_1a8._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ == paVar3) {
        local_2d8._24_3_ = (undefined3)local_1a8._24_8_;
        local_2d8[0x1b] = SUB81(local_1a8._24_8_,3);
        local_2d8._28_4_ = SUB84(local_1a8._24_8_,4);
      }
      else {
        local_2d8._0_8_ = local_1a8._0_8_;
        local_2d8._24_3_ = SUB43(uVar14,1);
      }
      local_2d8._8_8_ = local_1a8._8_8_;
      local_1a8._8_8_ = (_Rb_tree_node_base *)0x0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_2b8._M_p = (pointer)this->_vptr_schema;
      prStack_2b0 = this->root_;
      paVar32 = paVar3;
      if (prStack_2b0 != (root_schema *)0x0) {
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          pp_Var35 = (_Base_ptr *)
                     ((long)&(prStack_2b0->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var35 = *(int *)pp_Var35 + 1;
          UNLOCK();
        }
        else {
          pp_Var35 = (_Base_ptr *)
                     ((long)&(prStack_2b0->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var35 = *(int *)pp_Var35 + 1;
        }
      }
      local_1a8._0_8_ = paVar3;
      pVar43 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
               ::_M_get_insert_unique_pos
                         ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                           *)psVar24,(key_type *)local_2d8);
      p_Var23 = pVar43.second;
      if (p_Var23 != (_Rb_tree_node_base *)0x0) {
        bVar42 = true;
        if (paVar31 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)p_Var23 && pVar43.first == (_Rb_tree_node_base *)0x0) {
          std::__cxx11::string::compare((string *)local_2d8);
          bVar42 = (bool)(extraout_var_00 >> 7);
        }
        p_Var26 = (_Rb_tree_node_base *)operator_new(0x50);
        *(_Base_ptr **)(p_Var26 + 1) = &p_Var26[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var26 + 1),local_2d8._0_8_,
                   (char *)(local_2d8._0_8_ + (long)(_Rep_type *)local_2d8._8_8_));
        prVar21 = prStack_2b0;
        p_Var26[2]._M_parent = (_Base_ptr)0x0;
        prStack_2b0 = (root_schema *)0x0;
        *(pointer *)(p_Var26 + 2) = local_2b8._M_p;
        p_Var26[2]._M_parent = (_Base_ptr)prVar21;
        local_2b8._M_p = (pointer)0x0;
        std::_Rb_tree_insert_and_rebalance(bVar42,p_Var26,p_Var23,(_Rb_tree_node_base *)paVar31);
        psVar2 = &(psVar24->schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar2 = *psVar2 + 1;
        paVar32 = paVar31;
      }
      if (prStack_2b0 != (root_schema *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prStack_2b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,
                        CONCAT17(local_2d8[0x17],
                                 CONCAT16(local_2d8[0x16],
                                          CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)local_2d8,pjVar40);
      iVar27 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
               ::find(&psVar24->unresolved,(key_type *)local_2d8);
      _Var34._M_pi = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_,
                        CONCAT17(local_2d8[0x17],
                                 CONCAT16(local_2d8[0x16],
                                          CONCAT24(local_2d8._20_2_,local_2d8._16_4_))) + 1);
        _Var34._M_pi = extraout_RDX_03;
      }
      __p = (_Link_type)&(psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header;
      if ((_Link_type)iVar27._M_node != __p) {
        lVar10 = *(long *)(iVar27._M_node + 2);
        *(_func_int ***)(lVar10 + 0x40) = this->_vptr_schema;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(lVar10 + 0x48),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f0);
        this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                   *)std::_Rb_tree_rebalance_for_erase(iVar27._M_node,(_Rb_tree_node_base *)__p);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
        ::_M_drop_node(this_01,__p);
        psVar2 = &(psVar24->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar2 = *psVar2 - 1;
        _Var34._M_pi = extraout_RDX_04;
      }
      if (schema->m_type == object) {
        local_1c8._0_8_ = schema;
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)local_1a8,schema);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)local_2d8,
                   (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_1a8,0);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1a8,
              (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1c8);
        while (bVar42 = nlohmann::json_abi_v3_11_2::detail::
                        iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_2d8,
                                   (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_1a8), uVar37 = local_220._0_8_, !bVar42) {
          key_00 = nlohmann::json_abi_v3_11_2::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_2d8);
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)nlohmann::json_abi_v3_11_2::detail::
                       iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_2d8);
          nlohmann::json_schema::root_schema::insert_unknown_keyword
                    ((root_schema *)uVar37,pjVar40,key_00,(json *)paVar32);
          if (*(char *)local_2d8._0_8_ == '\x02') {
            lVar10 = CONCAT17(local_2d8[0x17],
                              CONCAT16(local_2d8[0x16],CONCAT24(local_2d8._20_2_,local_2d8._16_4_)))
                     + 0x10;
            local_2d8._16_4_ = (undefined4)lVar10;
            local_2d8._20_2_ = (undefined2)((ulong)lVar10 >> 0x20);
            local_2d8[0x16] = (undefined1)((ulong)lVar10 >> 0x30);
            local_2d8[0x17] = (undefined1)((ulong)lVar10 >> 0x38);
          }
          else if (*(char *)local_2d8._0_8_ == '\x01') {
            local_2d8._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_2d8._8_8_);
          }
          else {
            lVar10 = CONCAT44(local_2d8._28_4_,CONCAT13(local_2d8[0x1b],local_2d8._24_3_)) + 1;
            local_2d8._24_3_ = (undefined3)lVar10;
            local_2d8[0x1b] = (undefined1)((ulong)lVar10 >> 0x18);
            local_2d8._28_4_ = (undefined4)((ulong)lVar10 >> 0x20);
          }
          local_2b8._M_p = local_2b8._M_p + 1;
        }
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)local_1a8);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)local_2d8);
        _Var34._M_pi = extraout_RDX_05;
      }
      pjVar40 = pjVar40 + 1;
    } while (pjVar40 != pjVar9);
  }
  sVar44.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var34._M_pi;
  sVar44.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar44.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<schema> schema::make(json &schema,
                                     root_schema *root,
                                     const std::vector<std::string> &keys,
                                     std::vector<nlohmann::json_uri> uris)
{
	// remove URIs which contain plain name identifiers, as sub-schemas cannot be referenced
	for (auto uri = uris.begin(); uri != uris.end();)
		if (uri->identifier() != "")
			uri = uris.erase(uri);
		else
			uri++;

	// append to all URIs the keys for this sub-schema
	for (auto &key : keys)
		for (auto &uri : uris)
			uri = uri.append(key);

	std::shared_ptr<::schema> sch;

	// boolean schema
	if (schema.type() == json::value_t::boolean)
		sch = std::make_shared<boolean>(schema, root);
	else if (schema.type() == json::value_t::object) {

		auto attr = schema.find("$id"); // if $id is present, this schema can be referenced by this ID
		                                // as an additional URI
		if (attr != schema.end()) {
			if (std::find(uris.begin(),
			              uris.end(),
			              attr.value().get<std::string>()) == uris.end())
				uris.push_back(uris.back().derive(attr.value().get<std::string>())); // so add it to the list if it is not there already
			schema.erase(attr);
		}

		auto findDefinitions = [&](const std::string &defs) -> bool {
			attr = schema.find(defs);
			if (attr != schema.end()) {
				for (auto &def : attr.value().items())
					schema::make(def.value(), root, {defs, def.key()}, uris);
				schema.erase(attr);
				return true;
			}
			return false;
		};
		if (!findDefinitions("$defs")) {
			findDefinitions("definitions");
		}

		attr = schema.find("$ref");
		if (attr != schema.end()) { // this schema is a reference
			// the last one on the uri-stack is the last id seen before coming here,
			// so this is the origial URI for this reference, the $ref-value has thus be resolved from it
			auto id = uris.back().derive(attr.value().get<std::string>());
			sch = root->get_or_create_ref(id);

			schema.erase(attr);

			// special case where we break draft-7 and allow overriding of properties when a $ref is used
			attr = schema.find("default");
			if (attr != schema.end()) {
				// copy the referenced schema depending on the underlying type and modify the default value
				if (auto new_sch = sch->make_for_default_(sch, root, uris, attr.value())) {
					sch = new_sch;
				}
				schema.erase(attr);
			}
		} else {
			sch = std::make_shared<type_schema>(schema, root, uris);
		}

		schema.erase("$schema");
		schema.erase("title");
		schema.erase("description");
	} else {
		throw std::invalid_argument("invalid JSON-type for a schema for " + uris[0].to_string() + ", expected: boolean or object");
	}

	for (auto &uri : uris) { // for all URIs this schema is referenced by
		root->insert(uri, sch);

		if (schema.type() == json::value_t::object)
			for (auto &u : schema.items())
				root->insert_unknown_keyword(uri, u.key(), u.value()); // insert unknown keywords for later reference
	}
	return sch;
}